

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QKeyCombination>::reserve(QList<QKeyCombination> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QKeyCombination> *pQVar3;
  qsizetype qVar4;
  QKeyCombination *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QKeyCombination> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QKeyCombination> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QKeyCombination> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QKeyCombination> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QKeyCombination> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QKeyCombination> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QKeyCombination> *)capacity((QList<QKeyCombination> *)0x5aabff);
  qVar4 = QArrayDataPointer<QKeyCombination>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QKeyCombination>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QKeyCombination>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_005aada2;
    QArrayDataPointer<QKeyCombination>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QKeyCombination>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QKeyCombination>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QKeyCombination>::setFlag
                ((QArrayDataPointer<QKeyCombination> *)0x5aaca6,(ArrayOptions)f.i);
      goto LAB_005aada2;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QKeyCombination> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QKeyCombination>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QKeyCombination> *)
           QArrayDataPointer<QKeyCombination>::operator->(&local_38);
  QArrayDataPointer<QKeyCombination>::operator->(in_RDI);
  b = QArrayDataPointer<QKeyCombination>::begin((QArrayDataPointer<QKeyCombination> *)0x5aad26);
  QArrayDataPointer<QKeyCombination>::operator->(in_RDI);
  QArrayDataPointer<QKeyCombination>::end(pQVar3);
  QtPrivate::QGenericArrayOps<QKeyCombination>::copyAppend
            (in_stack_ffffffffffffff90,b,(QKeyCombination *)pQVar3);
  pDVar5 = QArrayDataPointer<QKeyCombination>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QKeyCombination> *)
         QArrayDataPointer<QKeyCombination>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QKeyCombination>::setFlag
              ((QArrayDataPointer<QKeyCombination> *)0x5aad89,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QKeyCombination>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QKeyCombination>::~QArrayDataPointer(pQVar3);
LAB_005aada2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}